

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRoundedEdgeFeature::IfcRoundedEdgeFeature(IfcRoundedEdgeFeature *this)

{
  IfcRoundedEdgeFeature *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x198,"IfcRoundedEdgeFeature");
  Schema_2x3::IfcEdgeFeature::IfcEdgeFeature
            (&this->super_IfcEdgeFeature,&PTR_construction_vtable_24__0106d020);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoundedEdgeFeature,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoundedEdgeFeature,_1UL> *)
             &(this->super_IfcEdgeFeature).field_0x178,&PTR_construction_vtable_24__0106d200);
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x106cea0;
  *(undefined8 *)&this->field_0x198 = 0x106d008;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x106cec8;
  (this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x106cef0;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x106cf18;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x106cf40;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x138 = 0x106cf68;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x148 = 0x106cf90;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    field_0x158 = 0x106cfb8;
  *(undefined8 *)&(this->super_IfcEdgeFeature).field_0x178 = 0x106cfe0;
  STEP::Maybe<double>::Maybe((Maybe<double> *)&(this->super_IfcEdgeFeature).field_0x188);
  return;
}

Assistant:

IfcRoundedEdgeFeature() : Object("IfcRoundedEdgeFeature") {}